

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf-sequencing-algorithm.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  string *psVar2;
  string *psVar3;
  pointer pcVar4;
  pointer pcVar5;
  _Base_ptr *pp_Var6;
  double dVar7;
  char **argv_00;
  uint uVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long *plVar15;
  ostream *poVar16;
  uint uVar17;
  size_type *psVar18;
  int n;
  int n_00;
  ulong uVar19;
  int iVar20;
  char *pcVar21;
  uint uVar22;
  int setup_00;
  uint __val;
  long lVar23;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  initializer_list<args::EitherFlag> in_03;
  initializer_list<args::EitherFlag> in_04;
  initializer_list<args::EitherFlag> in_05;
  initializer_list<args::EitherFlag> in_06;
  initializer_list<args::EitherFlag> in_07;
  initializer_list<args::EitherFlag> in_08;
  initializer_list<args::EitherFlag> in_09;
  initializer_list<args::EitherFlag> in_10;
  initializer_list<args::EitherFlag> in_11;
  initializer_list<args::EitherFlag> in_12;
  initializer_list<args::EitherFlag> in_13;
  initializer_list<args::EitherFlag> in_14;
  initializer_list<args::EitherFlag> in_15;
  initializer_list<args::EitherFlag> in_16;
  initializer_list<args::EitherFlag> in_17;
  initializer_list<args::EitherFlag> in_18;
  initializer_list<args::EitherFlag> in_19;
  initializer_list<args::EitherFlag> in_20;
  initializer_list<args::EitherFlag> in_21;
  initializer_list<args::EitherFlag> in_22;
  initializer_list<args::EitherFlag> in_23;
  initializer_list<args::EitherFlag> in_24;
  initializer_list<args::EitherFlag> in_25;
  initializer_list<args::EitherFlag> in_26;
  initializer_list<args::EitherFlag> in_27;
  initializer_list<args::EitherFlag> in_28;
  initializer_list<args::EitherFlag> in_29;
  initializer_list<args::EitherFlag> in_30;
  initializer_list<args::EitherFlag> in_31;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  string strategy;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file2;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _path;
  Collimator collimator;
  stringstream ss;
  string file;
  ValueFlag<double,_args::ValueReader<double>_> _prob_intensity;
  string s;
  string file2;
  string path;
  set<int,_std::less<int>,_std::allocator<int>_> l;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> volumes;
  vector<double,_std::allocator<double>_> Zmax;
  vector<double,_std::allocator<double>_> Zmin;
  vector<double,_std::allocator<double>_> w;
  Plan P;
  ValueFlag<double,_args::ValueReader<double>_> _alpha;
  ValueFlag<int,_args::ValueReader<int>_> _n;
  ArgumentParser parser;
  ValueFlag<double,_args::ValueReader<double>_> _temperature;
  Group setup;
  Group dao_ls;
  ValueFlag<double,_args::ValueReader<double>_> _beta;
  Group accept;
  ValueFlag<int,_args::ValueReader<int>_> _perturbation;
  ValueFlag<double,_args::ValueReader<double>_> _alphaT;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _strategy;
  Flag ls_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _step_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _max_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _initial_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _open_apertures;
  ValueFlag<int,_args::ValueReader<int>_> _max_apertures;
  ValueFlag<int,_args::ValueReader<int>_> _seed;
  ValueFlag<int,_args::ValueReader<int>_> _maxtime;
  Flag accept_sa;
  Flag accept_best;
  Flag ls_aperture;
  Flag all_rand;
  Flag closed_max;
  Flag closed_min;
  Flag open_min;
  Flag open_max;
  HelpFlag help;
  ValueFlag<int,_args::ValueReader<int>_> _maxiter;
  ValueFlag<int,_args::ValueReader<int>_> _maxratio;
  ValueFlag<int,_args::ValueReader<int>_> _maxdelta;
  ValueFlag<int,_args::ValueReader<int>_> _vsize;
  ValueFlag<int,_args::ValueReader<int>_> _bsize;
  char *local_2498;
  long local_2490;
  char local_2488 [20];
  int local_2474;
  undefined1 local_2470 [240];
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2380;
  ulong local_2290;
  undefined1 local_2288 [240];
  undefined1 local_2198 [56];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2160 [6];
  char **local_1fe0;
  int local_1fd8;
  int local_1fd4;
  undefined1 local_1fd0 [16];
  undefined1 local_1fc0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1fb8;
  undefined2 local_1fa8;
  undefined1 *local_1fa0 [2];
  undefined1 local_1f90 [64];
  ios_base local_1f50 [264];
  undefined1 *local_1e48;
  long local_1e40;
  undefined1 local_1e38 [16];
  ValueFlag<double,_args::ValueReader<double>_> local_1e28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d50;
  undefined1 *local_1d30;
  long local_1d28;
  undefined1 local_1d20 [16];
  char *local_1d10 [2];
  char local_1d00 [16];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1cf0;
  vector<double,_std::allocator<double>_> local_1cc0;
  vector<double,_std::allocator<double>_> local_1ca8;
  vector<double,_std::allocator<double>_> local_1c90;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> local_1c78;
  vector<double,_std::allocator<double>_> local_1c60;
  vector<double,_std::allocator<double>_> local_1c48;
  vector<double,_std::allocator<double>_> local_1c30;
  string local_1c18;
  string local_1bf8;
  string local_1bd8;
  string local_1bb8;
  string local_1b98;
  undefined1 local_1b78 [120];
  EvaluationFunction *local_1b00;
  ValueFlag<double,_args::ValueReader<double>_> local_1aa8;
  undefined1 local_19d0 [200];
  int local_1908;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1900;
  ArgumentParser local_18d0;
  ValueFlag<double,_args::ValueReader<double>_> local_1740;
  Group local_1668;
  Group local_1600;
  ValueFlag<double,_args::ValueReader<double>_> local_1598;
  Group local_14c0;
  ValueFlag<int,_args::ValueReader<int>_> local_1458;
  ValueFlag<double,_args::ValueReader<double>_> local_1388;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_12b0;
  FlagBase local_11c0;
  ValueFlag<int,_args::ValueReader<int>_> local_10f8;
  ValueFlag<int,_args::ValueReader<int>_> local_1028;
  ValueFlag<int,_args::ValueReader<int>_> local_f58;
  ValueFlag<int,_args::ValueReader<int>_> local_e88;
  ValueFlag<int,_args::ValueReader<int>_> local_db8;
  ValueFlag<int,_args::ValueReader<int>_> local_ce8;
  ValueFlag<int,_args::ValueReader<int>_> local_c18;
  FlagBase local_b48;
  FlagBase local_a80;
  FlagBase local_9b8;
  FlagBase local_8f0;
  FlagBase local_828;
  FlagBase local_760;
  FlagBase local_698;
  FlagBase local_5d0;
  FlagBase local_508;
  ValueFlag<int,_args::ValueReader<int>_> local_440;
  ValueFlag<int,_args::ValueReader<int>_> local_370;
  ValueFlag<int,_args::ValueReader<int>_> local_2a0;
  ValueFlag<int,_args::ValueReader<int>_> local_1d0;
  ValueFlag<int,_args::ValueReader<int>_> local_100;
  
  local_2498 = local_2488;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2498,"dao_ls","");
  local_1e48 = local_1e38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e48,"data/testinstance_0_70_140_210_280.txt","");
  local_1d30 = local_1d20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d30,"data/test_instance_coordinates.txt","");
  local_1d10[0] = local_1d00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d10,".","");
  local_2290 = time((time_t *)0x0);
  local_2198._0_8_ = local_2198 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2198,"********* IMRT-Solver (Aperture solver) *********","");
  local_1fd0._0_8_ = local_1fc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1fd0,
             "Example.\n.../AS -s ibo_ls --maxiter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --bsize=5 --vsize=20 --max-apertures=4 --seed=0 --open-apertures=1 --initial-intensity=4 --step-intensity=1 --file-dep=data/Equidistantes/equidist00.txt --file-coord=data/Equidistantes/equidist-coord.txt"
             ,"");
  args::ArgumentParser::ArgumentParser(&local_18d0,(string *)local_2198,(string *)local_1fd0);
  if ((undefined1 *)local_1fd0._0_8_ != local_1fc0) {
    operator_delete((void *)local_1fd0._0_8_);
  }
  if ((undefined1 *)local_2198._0_8_ != local_2198 + 0x10) {
    operator_delete((void *)local_2198._0_8_);
  }
  psVar2 = &local_12b0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  local_12b0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12b0,"help","");
  psVar3 = &local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"Display this help menu","")
  ;
  local_1fd0._0_2_ = 0x6801;
  local_1fc0 = (undefined1  [8])0x0;
  local_1fb8._0_8_ = local_1fb8._0_8_ & 0xffffffffffffff00;
  local_1fa8 = 0;
  local_1fa0[0] = local_1f90;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1fa0,"help","");
  in._M_len = 2;
  in._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in);
  local_2474 = argc;
  args::Flag::Flag((Flag *)&local_508,&local_18d0.super_Group,(string *)&local_12b0,
                   (string *)&local_2380,(Matcher *)local_2198,false);
  local_508.super_NamedBase.super_Base._vptr_Base = (_func_int **)&PTR__FlagBase_00133918;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  lVar23 = 0;
  do {
    if (local_1f90 + lVar23 != *(undefined1 **)((long)local_1fa0 + lVar23)) {
      operator_delete(*(undefined1 **)((long)local_1fa0 + lVar23));
    }
    lVar23 = lVar23 + -0x28;
  } while (lVar23 != -0x50);
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar3) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_12b0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_12b0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"string","");
  pcVar1 = local_2470 + 0x10;
  local_2470._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2470,"Strategy  (dao_ls|ibo_ls)","");
  local_1fd0._0_2_ = 0x7301;
  local_1fc0 = (undefined1  [8])0x0;
  local_1fb8._0_8_ = local_1fb8._0_8_ & 0xffffffffffffff00;
  local_1fa8 = 0;
  local_1fd0._8_8_ = &local_1fb8;
  local_1fa0[0] = local_1f90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1fa0,"strategy","");
  in_00._M_len = 2;
  in_00._M_array = (iterator)local_1fd0;
  local_1fe0 = argv;
  args::Matcher::Matcher((Matcher *)local_2198,in_00);
  pcVar4 = local_2288 + 0x10;
  local_2288._8_8_ = 0;
  local_2288._16_8_ = local_2288._16_8_ & 0xffffffffffffff00;
  local_2288._0_8_ = pcVar4;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(&local_12b0,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
              (Matcher *)local_2198,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2288,false)
  ;
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  lVar23 = 0;
  do {
    if (local_1f90 + lVar23 != *(undefined1 **)((long)local_1fa0 + lVar23)) {
      operator_delete(*(undefined1 **)((long)local_1fa0 + lVar23));
    }
    lVar23 = lVar23 + -0x28;
  } while (lVar23 != -0x50);
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar3) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"int","");
  psVar2 = &local_1aa8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  local_1aa8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct((ulong)&local_1aa8,'\x02');
  *(undefined2 *)
   &((_Alloc_hider *)
    local_1aa8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base)->_M_p =
       0x3032;
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_1aa8,0,(char *)0x0,0x1262a8);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"bsize","");
  in_01._M_len = 1;
  in_01._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_01);
  local_1598.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_100,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(int *)&local_1598,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((string *)local_1aa8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_1aa8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar3) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"int","");
  local_1aa8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct((ulong)&local_1aa8,'\x02');
  *(undefined2 *)
   &((_Alloc_hider *)
    local_1aa8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base)->_M_p =
       0x3035;
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_1aa8,0,(char *)0x0,0x1262dc);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"vsize","");
  in_02._M_len = 1;
  in_02._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_02);
  local_1598.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_1d0,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(int *)&local_1598,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((string *)local_1aa8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_1aa8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar3) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"int","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1aa8,
             vsnprintf,0x148,"%f",0);
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_1aa8,0,(char *)0x0,0x126306);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"maxdelta","");
  in_03._M_len = 1;
  in_03._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_03);
  local_1598.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_2a0,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(int *)&local_1598,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((string *)local_1aa8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_1aa8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar3) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"int","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1aa8,
             vsnprintf,0x148,"%f",0);
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_1aa8,0,(char *)0x0,0x12631c);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"maxratio","");
  in_04._M_len = 1;
  in_04._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_04);
  local_1598.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_370,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(int *)&local_1598,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((string *)local_1aa8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_1aa8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar3) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"double","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1598,
             vsnprintf,0x148,"%f",0);
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_1598,0,(char *)0x0,0x126339);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"alpha","");
  in_05._M_len = 1;
  in_05._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_05);
  local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&local_1aa8,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(double *)&local_1e28,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((string *)
      CONCAT44(local_1598.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base.
               _4_4_,local_1598.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                     _vptr_Base._0_4_) !=
      &local_1598.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1598.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                             super_Base._vptr_Base._4_4_,
                             local_1598.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                             super_Base._vptr_Base._0_4_));
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar3) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"double","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e28,
             vsnprintf,0x148,"%f",0);
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_1e28,0,(char *)0x0,0x126366);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"beta","");
  in_06._M_len = 1;
  in_06._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_06);
  local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&local_1598,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(double *)&local_1740,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((string *)local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar3) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"int","");
  local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  std::__cxx11::string::_M_construct((ulong)&local_1e28,'\x04');
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                     _vptr_Base,4,5000);
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_1e28,0,(char *)0x0,0x12638c);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"maxiter","");
  in_07._M_len = 1;
  in_07._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_07);
  local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base &
       0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_440,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(int *)&local_1740,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((string *)local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar3) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"int","");
  local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  std::__cxx11::string::_M_construct((ulong)&local_1e28,'\x01');
  *(undefined1 *)
   &((_Alloc_hider *)
    local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base)->_M_p =
       0x30;
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_1e28,0,(char *)0x0,0x1263ab);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"maxtime","");
  in_08._M_len = 1;
  in_08._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_08);
  local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base &
       0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_c18,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(int *)&local_1740,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((string *)local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar3) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"int","");
  uVar22 = (uint)local_2290;
  __val = -uVar22;
  if (0 < (int)uVar22) {
    __val = uVar22;
  }
  uVar22 = 1;
  if (9 < __val) {
    uVar19 = (ulong)__val;
    uVar8 = 4;
    do {
      uVar22 = uVar8;
      uVar17 = (uint)uVar19;
      if (uVar17 < 100) {
        uVar22 = uVar22 - 2;
        goto LAB_00107a6f;
      }
      if (uVar17 < 1000) {
        uVar22 = uVar22 - 1;
        goto LAB_00107a6f;
      }
      if (uVar17 < 10000) goto LAB_00107a6f;
      uVar19 = uVar19 / 10000;
      uVar8 = uVar22 + 4;
    } while (99999 < uVar17);
    uVar22 = uVar22 + 1;
  }
LAB_00107a6f:
  uVar19 = local_2290 >> 0x1f;
  local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  std::__cxx11::string::_M_construct
            ((ulong)&local_1e28,(char)uVar22 - ((char)(local_2290 >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)&((_Alloc_hider *)
                             local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                             super_Base._vptr_Base)->_M_p + (uVar19 & 1)),uVar22,__val);
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_1e28,0,(char *)0x0,0x1263cd);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"seed","");
  in_09._M_len = 1;
  in_09._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_09);
  local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base &
       0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_ce8,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(int *)&local_1740,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((string *)local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2198._0_8_ = local_2198 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2198,"Direct aperture local search:","");
  local_1fd0._8_8_ = (pointer)0x0;
  local_1fd0._0_8_ = args::Group::Validators::DontCare;
  local_1fb8._0_8_ =
       std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::_M_invoke;
  local_1fc0 = (undefined1  [8])
               std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
               _M_manager;
  args::Group::Group(&local_1600,&local_18d0.super_Group,(string *)local_2198,
                     (function<bool_(const_args::Group_&)> *)local_1fd0);
  if (local_1fc0 != (undefined1  [8])0x0) {
    (*(code *)local_1fc0)(local_1fd0,local_1fd0,3);
  }
  if ((undefined1 *)local_2198._0_8_ != local_2198 + 0x10) {
    operator_delete((void *)local_2198._0_8_);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"int","");
  local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  std::__cxx11::string::_M_construct((ulong)&local_1e28,'\x01');
  *(undefined1 *)
   &((_Alloc_hider *)
    local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base)->_M_p =
       0x35;
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_1e28,0,(char *)0x0,0x1263f8);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"max-apertures","");
  in_10._M_len = 1;
  in_10._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_10);
  local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base &
       0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_db8,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(int *)&local_1740,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((string *)local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"int","");
  local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  std::__cxx11::string::_M_construct((ulong)&local_1e28,'\x02');
  *(undefined1 *)
   ((long)&((_Alloc_hider *)
           local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base)->
           _M_p + 1) = 0x31;
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_1e28,0,(char *)0x0,0x12642b);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"open-apertures","");
  in_11._M_len = 1;
  in_11._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_11);
  local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base &
       0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_e88,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(int *)&local_1740,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((string *)local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"int","");
  local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  std::__cxx11::string::_M_construct((ulong)&local_1e28,'\x01');
  *(undefined1 *)
   &((_Alloc_hider *)
    local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base)->_M_p =
       0x32;
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_1e28,0,(char *)0x0,0x126472);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"initial-intensity","")
  ;
  in_12._M_len = 1;
  in_12._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_12);
  local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base &
       0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_f58,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(int *)&local_1740,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((string *)local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"int","");
  local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  std::__cxx11::string::_M_construct((ulong)&local_1e28,'\x02');
  *(undefined2 *)
   &((_Alloc_hider *)
    local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base)->_M_p =
       0x3832;
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_1e28,0,(char *)0x0,0x1264a8);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"max-intensity","");
  in_13._M_len = 1;
  in_13._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_13);
  local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base &
       0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_1028,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(int *)&local_1740,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((string *)local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"int","");
  local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  std::__cxx11::string::_M_construct((ulong)&local_1e28,'\x01');
  *(undefined1 *)
   &((_Alloc_hider *)
    local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base)->_M_p =
       0x32;
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_1e28,0,(char *)0x0,0x1264d6);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"step-intensity","");
  in_14._M_len = 1;
  in_14._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_14);
  local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)
       ((ulong)local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base &
       0xffffffff00000000);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_10f8,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(int *)&local_1740,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((string *)local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2198._0_8_ = local_2198 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2198,
             "Initial solution setup (these override all provided configurations):","");
  local_1fd0._8_8_ = (pointer)0x0;
  local_1fd0._0_8_ = args::Group::Validators::DontCare;
  local_1fb8._0_8_ =
       std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::_M_invoke;
  local_1fc0 = (undefined1  [8])
               std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
               _M_manager;
  args::Group::Group(&local_1668,&local_18d0.super_Group,(string *)local_2198,
                     (function<bool_(const_args::Group_&)> *)local_1fd0);
  psVar2 = &local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  if (local_1fc0 != (undefined1  [8])0x0) {
    (*(code *)local_1fc0)(local_1fd0,local_1fd0,3);
  }
  if ((undefined1 *)local_2198._0_8_ != local_2198 + 0x10) {
    operator_delete((void *)local_2198._0_8_);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"open_max","");
  local_2470._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2470,"Open aperture setup with max intensity","");
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"open-max-setup","");
  in_15._M_len = 1;
  in_15._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_15);
  args::Flag::Flag((Flag *)&local_5d0,&local_1668,(string *)&local_2380,(string *)local_2470,
                   (Matcher *)local_2198,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"open_min","");
  local_2470._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2470,"Open aperture setup with min intensity","");
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"open-min-setup","");
  in_16._M_len = 1;
  in_16._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_16);
  args::Flag::Flag((Flag *)&local_698,&local_1668,(string *)&local_2380,(string *)local_2470,
                   (Matcher *)local_2198,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"closed_min","");
  local_2470._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2470,"Closed aperture setup with min intensity","");
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"closed-min-setup","");
  in_17._M_len = 1;
  in_17._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_17);
  args::Flag::Flag((Flag *)&local_760,&local_1668,(string *)&local_2380,(string *)local_2470,
                   (Matcher *)local_2198,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"closed_max","");
  local_2470._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2470,"Closed aperture setup with max intensity","");
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"closed-max-setup","");
  in_18._M_len = 1;
  in_18._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_18);
  args::Flag::Flag((Flag *)&local_828,&local_1668,(string *)&local_2380,(string *)local_2470,
                   (Matcher *)local_2198,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"all_rand","");
  local_2470._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2470,"Random aperture setup with random intensity","");
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"rand-setup","");
  in_19._M_len = 1;
  in_19._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_19);
  args::Flag::Flag((Flag *)&local_8f0,&local_1668,(string *)&local_2380,(string *)local_2470,
                   (Matcher *)local_2198,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"ls_apertures","");
  local_2470._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2470,"Apply aperture local search","");
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"ls-aperture","");
  in_20._M_len = 1;
  in_20._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_20);
  args::Flag::Flag((Flag *)&local_9b8,&local_1600,(string *)&local_2380,(string *)local_2470,
                   (Matcher *)local_2198,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"ls_intensity","");
  local_2470._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2470,"Apply intensity local search","");
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"ls-intensity","");
  in_21._M_len = 1;
  in_21._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_21);
  args::Flag::Flag((Flag *)&local_11c0,&local_1600,(string *)&local_2380,(string *)local_2470,
                   (Matcher *)local_2198,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"double","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1740,
             vsnprintf,0x148,"%f",0x9999999a);
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_1740,0,(char *)0x0,0x126702);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"prob-intensity","");
  in_22._M_len = 1;
  in_22._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_22);
  local_1388.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&local_1e28,&local_1600,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(double *)&local_1388,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((string *)local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2198._0_8_ = local_2198 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2198,"Acceptance criterion:","");
  local_1fd0._8_8_ = (pointer)0x0;
  local_1fd0._0_8_ = args::Group::Validators::AtMostOne;
  local_1fb8._0_8_ =
       std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::_M_invoke;
  local_1fc0 = (undefined1  [8])
               std::_Function_handler<bool_(const_args::Group_&),_bool_(*)(const_args::Group_&)>::
               _M_manager;
  args::Group::Group(&local_14c0,&local_18d0.super_Group,(string *)local_2198,
                     (function<bool_(const_args::Group_&)> *)local_1fd0);
  if (local_1fc0 != (undefined1  [8])0x0) {
    (*(code *)local_1fc0)(local_1fd0,local_1fd0,3);
  }
  if ((undefined1 *)local_2198._0_8_ != local_2198 + 0x10) {
    operator_delete((void *)local_2198._0_8_);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"accept-best","");
  local_2470._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2470,"Accept only improvement","")
  ;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"accept-best","");
  in_23._M_len = 1;
  in_23._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_23);
  args::Flag::Flag((Flag *)&local_a80,&local_14c0,(string *)&local_2380,(string *)local_2470,
                   (Matcher *)local_2198,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"accept-sa","");
  local_2470._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2470,"Accept as simulated annealing","");
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"accept-sa","");
  in_24._M_len = 1;
  in_24._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_24);
  args::Flag::Flag((Flag *)&local_b48,&local_14c0,(string *)&local_2380,(string *)local_2470,
                   (Matcher *)local_2198,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"double","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1388,
             vsnprintf,0x148,"%f");
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_1388,0,(char *)0x0,0x12679b);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"temperature","");
  in_25._M_len = 1;
  in_25._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_25);
  local_1458.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&local_1740,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(double *)&local_1458,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((string *)local_1388.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_1388.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_1388.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"double","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1458,
             vsnprintf,0x148,"%f",0x66666666);
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_1458,0,(char *)0x0,0x1267cf);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"alphaT","");
  in_26._M_len = 1;
  in_26._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_26);
  local_19d0._0_8_ = (pointer)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            (&local_1388,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(double *)local_19d0,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((string *)local_1458.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != &local_1458.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help) {
    operator_delete(local_1458.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2380,"int","");
  pcVar5 = local_19d0 + 0x10;
  local_19d0._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct((ulong)local_19d0,'\x01');
  *(char *)local_19d0._0_8_ = '2';
  plVar15 = (long *)std::__cxx11::string::replace((ulong)local_19d0,0,(char *)0x0,0x1267fb);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2288._16_8_ = *psVar18;
    local_2288._24_8_ = plVar15[3];
    local_2288._0_8_ = pcVar4;
  }
  else {
    local_2288._16_8_ = *psVar18;
    local_2288._0_8_ = (size_type *)*plVar15;
  }
  local_2288._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_2288);
  psVar18 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar18) {
    local_2470._16_8_ = *psVar18;
    local_2470._24_4_ = (undefined4)plVar15[3];
    local_2470._28_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_2470._0_8_ = pcVar1;
  }
  else {
    local_2470._16_8_ = *psVar18;
    local_2470._0_8_ = (size_type *)*plVar15;
  }
  local_2470._8_8_ = plVar15[1];
  *plVar15 = (long)psVar18;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"perturbation-size","")
  ;
  in_27._M_len = 1;
  in_27._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_27);
  local_1b78._0_8_ = (ulong)(uint)local_1b78._4_4_ << 0x20;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_1458,&local_18d0.super_Group,(string *)&local_2380,(string *)local_2470,
             (Matcher *)local_2198,(int *)local_1b78,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((pointer)local_19d0._0_8_ != pcVar5) {
    operator_delete((void *)local_19d0._0_8_);
  }
  if ((string *)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar2) {
    operator_delete(local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  local_2470._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2470,"string","");
  local_2288._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2288,"File with the deposition matrix","");
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"file-dep","");
  in_28._M_len = 1;
  in_28._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_28);
  local_19d0._8_8_ = 0;
  local_19d0[0x10] = '\0';
  local_19d0._0_8_ = pcVar5;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(&local_2380,&local_18d0.super_Group,(string *)local_2470,(string *)local_2288,
              (Matcher *)local_2198,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_19d0,false)
  ;
  if ((pointer)local_19d0._0_8_ != pcVar5) {
    operator_delete((void *)local_19d0._0_8_);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  if ((pointer)local_2470._0_8_ != pcVar1) {
    operator_delete((void *)local_2470._0_8_);
  }
  local_2288._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2288,"string","");
  local_19d0._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19d0,"File with the beam coordinates","");
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"file-coord","");
  in_29._M_len = 1;
  in_29._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_29);
  pcVar1 = local_1b78 + 0x10;
  local_1b78._8_8_ = 0;
  local_1b78[0x10] = '\0';
  local_1b78._0_8_ = pcVar1;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2470,&local_18d0.super_Group,(string *)local_2288,(string *)local_19d0,
              (Matcher *)local_2198,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b78,false)
  ;
  if ((pointer)local_1b78._0_8_ != pcVar1) {
    operator_delete((void *)local_1b78._0_8_);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_19d0._0_8_ != pcVar5) {
    operator_delete((void *)local_19d0._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  local_2288._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2288,"int","");
  local_1b78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b78,"Number of instance","");
  local_1fd0._0_2_ = 0x6e01;
  local_1fc0 = (undefined1  [8])0x0;
  local_1fb8._0_8_ = local_1fb8._0_8_ & 0xffffffffffffff00;
  in_30._M_len = 1;
  in_30._M_array = (iterator)local_1fd0;
  local_1fd0._8_8_ = &local_1fb8;
  args::Matcher::Matcher((Matcher *)local_2198,in_30);
  local_1cf0._M_impl._0_8_ = (ulong)(uint)local_1cf0._M_impl._4_4_ << 0x20;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)local_19d0,&local_18d0.super_Group,
             (string *)local_2288,(string *)local_1b78,(Matcher *)local_2198,(int *)&local_1cf0,
             false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((pointer)local_1b78._0_8_ != pcVar1) {
    operator_delete((void *)local_1b78._0_8_);
  }
  if ((pointer)local_2288._0_8_ != pcVar4) {
    operator_delete((void *)local_2288._0_8_);
  }
  local_1b78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b78,"string","");
  argv_00 = local_1fe0;
  pp_Var6 = &local_1cf0._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_1cf0._M_impl._0_8_ = pp_Var6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1cf0,
             "Absolute path of the executable (if it is executed from other directory)","");
  local_1fd0._0_8_ = local_1fd0._0_8_ & 0xffffffffffff0000;
  local_1fd0._8_8_ = &local_1fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_1fd0 + 8),"path","");
  in_31._M_len = 1;
  in_31._M_array = (iterator)local_1fd0;
  args::Matcher::Matcher((Matcher *)local_2198,in_31);
  local_1d50._M_string_length = 0;
  local_1d50.field_2._M_local_buf[0] = '\0';
  local_1d50._M_dataplus._M_p = (pointer)&local_1d50.field_2;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2288,&local_18d0.super_Group,(string *)local_1b78,(string *)&local_1cf0,
              (Matcher *)local_2198,&local_1d50,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d50._M_dataplus._M_p != &local_1d50.field_2) {
    operator_delete(local_1d50._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_2160);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1fd0._8_8_ != &local_1fb8) {
    operator_delete((void *)local_1fd0._8_8_);
  }
  if ((_Base_ptr *)local_1cf0._M_impl._0_8_ != pp_Var6) {
    operator_delete((void *)local_1cf0._M_impl._0_8_);
  }
  if ((pointer)local_1b78._0_8_ != pcVar1) {
    operator_delete((void *)local_1b78._0_8_);
  }
  args::ArgumentParser::ParseCLI(&local_18d0,local_2474,argv_00);
  cVar9 = (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)((long)local_12b0.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                               super_Base._vptr_Base + 0x10))->_M_allocated_capacity)();
  if (cVar9 != '\0') {
    std::__cxx11::string::_M_assign((string *)&local_2498);
  }
  (*local_100.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (*local_1d0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (*local_2a0.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (*local_370.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)local_1aa8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                       _vptr_Base + 0x10))->_M_allocated_capacity)();
  (**(code **)(CONCAT44(local_1598.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                        _vptr_Base._4_4_,
                        local_1598.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                        _vptr_Base._0_4_) + 0x10))();
  (*local_440.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  iVar10 = (*local_c18.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  iVar20 = 0;
  if ((char)iVar10 != '\0') {
    iVar20 = local_c18.value;
  }
  iVar11 = (*local_db8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  iVar10 = 5;
  if ((char)iVar11 != '\0') {
    iVar10 = local_db8.value;
  }
  iVar12 = (*local_e88.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  iVar11 = -1;
  if ((char)iVar12 != '\0') {
    iVar11 = local_e88.value;
  }
  iVar12 = (*local_ce8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  if ((char)iVar12 != '\0') {
    local_2290 = (ulong)(uint)local_ce8.value;
  }
  iVar13 = (*local_f58.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  iVar12 = 2;
  if ((char)iVar13 != '\0') {
    iVar12 = local_f58.value;
  }
  iVar14 = (*local_1028.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  iVar13 = 0x1c;
  if ((char)iVar14 != '\0') {
    iVar13 = local_1028.value;
  }
  local_2474 = iVar11;
  iVar11 = (*local_10f8.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])
                     ();
  local_1fd4 = 2;
  if ((char)iVar11 != '\0') {
    local_1fd4 = local_10f8.value;
  }
  (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)local_1e28.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                       _vptr_Base + 0x10))->_M_allocated_capacity)();
  (*local_1740.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (*local_1388.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  (*local_9b8.super_NamedBase.super_Base._vptr_Base[2])(&local_9b8);
  (*local_11c0.super_NamedBase.super_Base._vptr_Base[2])();
  iVar11 = (*local_9b8.super_NamedBase.super_Base._vptr_Base[2])(&local_9b8);
  if ((char)iVar11 == '\0') {
    (*local_11c0.super_NamedBase.super_Base._vptr_Base[2])();
  }
  local_1fe0 = (char **)CONCAT44(local_1fe0._4_4_,iVar10);
  (*local_b48.super_NamedBase.super_Base._vptr_Base[2])();
  (*local_a80.super_NamedBase.super_Base._vptr_Base[2])();
  (*local_1458.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  cVar9 = (**(code **)(local_19d0._0_8_ + 0x10))();
  iVar10 = 0;
  if (cVar9 != '\0') {
    iVar10 = local_1908;
  }
  iVar14 = (*local_5d0.super_NamedBase.super_Base._vptr_Base[2])();
  setup_00 = 1;
  iVar11 = iVar13;
  if ((char)iVar14 == '\0') {
    iVar14 = (*local_698.super_NamedBase.super_Base._vptr_Base[2])();
    iVar11 = 0;
    if ((char)iVar14 == '\0') {
      iVar14 = (*local_760.super_NamedBase.super_Base._vptr_Base[2])();
      setup_00 = 2;
      if ((char)iVar14 == '\0') {
        iVar14 = (*local_828.super_NamedBase.super_Base._vptr_Base[2])();
        setup_00 = 3;
        iVar11 = iVar13;
        if ((char)iVar14 == '\0') {
          iVar11 = (*local_8f0.super_NamedBase.super_Base._vptr_Base[2])();
          setup_00 = (uint)(byte)((byte)iVar11 ^ 1) * 2 + 4;
          iVar11 = iVar12;
        }
      }
    }
    else {
      setup_00 = 0;
    }
  }
  cVar9 = (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)((long)local_2380.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                               super_Base._vptr_Base + 0x10))->_M_allocated_capacity)();
  if (cVar9 != '\0') {
    std::__cxx11::string::_M_assign((string *)&local_1e48);
  }
  cVar9 = (**(code **)(local_2470._0_8_ + 0x10))();
  if (cVar9 != '\0') {
    std::__cxx11::string::_M_assign((string *)&local_1d30);
  }
  cVar9 = (**(code **)(local_2288._0_8_ + 0x10))();
  if (cVar9 != '\0') {
    std::__cxx11::string::_M_assign((string *)local_1d10);
  }
  chdir(local_1d10[0]);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  iVar12 = std::__cxx11::string::compare((char *)&local_2498);
  if (iVar12 == 0) {
    pcVar21 = "##******** IMRT-Solver (Direct Aperture Optimization Local Search) *********";
  }
  else {
    iVar12 = std::__cxx11::string::compare((char *)&local_2498);
    if (iVar12 != 0) goto LAB_0010a176;
    pcVar21 = "##******** IMRT-Solver (Intensity-based Optimization Local Search) *********";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar21,0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
LAB_0010a176:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "##**************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  local_2198._0_8_ = (pointer)0x3ff0000000000000;
  local_2198._8_8_ = 0x3ff0000000000000;
  local_2198._16_8_ = 0x3ff0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)local_2198;
  std::vector<double,_std::allocator<double>_>::vector(&local_1c30,__l,(allocator_type *)local_1fd0)
  ;
  local_2198._0_8_ = (pointer)0x0;
  local_2198._8_8_ = 0;
  local_2198._16_8_ = 0x4053000000000000;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_2198;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_1c48,__l_00,(allocator_type *)local_1fd0);
  local_2198._0_8_ = (pointer)0x4050400000000000;
  local_2198._8_8_ = 0x404e000000000000;
  local_2198._16_8_ = 0x408f400000000000;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_2198;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_1c60,__l_01,(allocator_type *)local_1fd0);
  local_1fd8 = iVar20;
  local_1b98._M_dataplus._M_p = (pointer)&local_1b98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b98,local_1d30,local_1d30 + local_1d28);
  local_1bb8._M_dataplus._M_p = (pointer)&local_1bb8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1bb8,local_1e48,local_1e48 + local_1e40);
  get_angles((set<int,_std::less<int>,_std::allocator<int>_> *)&local_1900,&local_1bb8,n);
  imrt::Collimator::Collimator
            ((Collimator *)local_2198,&local_1b98,
             (set<int,_std::less<int>,_std::allocator<int>_> *)&local_1900);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1900);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1bb8._M_dataplus._M_p != &local_1bb8.field_2) {
    operator_delete(local_1bb8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b98._M_dataplus._M_p != &local_1b98.field_2) {
    operator_delete(local_1b98._M_dataplus._M_p);
  }
  local_1bd8._M_dataplus._M_p = (pointer)&local_1bd8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1bd8,local_1e48,local_1e48 + local_1e40);
  createVolumes(&local_1c78,&local_1bd8,(Collimator *)local_2198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1bd8._M_dataplus._M_p != &local_1bd8.field_2) {
    operator_delete(local_1bd8._M_dataplus._M_p);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_1c90,&local_1c30);
  std::vector<double,_std::allocator<double>_>::vector(&local_1ca8,&local_1c48);
  std::vector<double,_std::allocator<double>_>::vector(&local_1cc0,&local_1c60);
  imrt::Plan::Plan((Plan *)local_1b78,&local_1c90,&local_1ca8,&local_1cc0,(Collimator *)local_2198,
                   &local_1c78,(int)local_1fe0,iVar13,iVar11,local_1fd4,local_2474,setup_00,
                   (char *)0x0);
  if (local_1cc0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1cc0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1ca8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1ca8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1c90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1c90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_1bf8._M_dataplus._M_p = (pointer)&local_1bf8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1bf8,"data/Equidistantes/optimalSolutions.txt","");
  imrt::Plan::writeIntensities((Plan *)local_1b78,&local_1bf8,iVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1bf8._M_dataplus._M_p != &local_1bf8.field_2) {
    operator_delete(local_1bf8._M_dataplus._M_p);
  }
  imrt::Plan::printIntensity((Plan *)local_1b78,0);
  imrt::Plan::printIntensity((Plan *)local_1b78,1);
  imrt::Plan::printIntensity((Plan *)local_1b78,2);
  imrt::Plan::printIntensity((Plan *)local_1b78,3);
  imrt::Plan::printIntensity((Plan *)local_1b78,4);
  dVar7 = imrt::Plan::eval((Plan *)local_1b78);
  poVar16 = std::ostream::_M_insert<double>(dVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
  std::ostream::put((char)poVar16);
  std::ostream::flush();
  imrt::EvaluationFunction::generate_voxel_dose_functions(local_1b00);
  local_1c18._M_dataplus._M_p = (pointer)&local_1c18.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c18,local_1e48,local_1e48 + local_1e40);
  get_angles((set<int,_std::less<int>,_std::allocator<int>_> *)&local_1cf0,&local_1c18,n_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c18._M_dataplus._M_p != &local_1c18.field_2) {
    operator_delete(local_1c18._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1fd0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1fc0,"python plotter/plot.py ",0x17);
  poVar16 = (ostream *)
            std::ostream::operator<<
                      ((ostream *)local_1fc0,
                       (int)((_Base_ptr)
                            ((long)local_1cf0._M_impl.super__Rb_tree_header._M_header._M_left + 0x20
                            ))->_M_color / 5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"_",1);
  poVar16 = std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_2498,local_2490);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"_",1);
  poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,iVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"_",1);
  poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,setup_00);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"_",1);
  poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,local_1fd8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"_",1);
  poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,(int)local_2290);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,".pdf",4);
  std::__cxx11::stringbuf::str();
  system(local_1d50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d50._M_dataplus._M_p != &local_1d50.field_2) {
    operator_delete(local_1d50._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1fd0);
  std::ios_base::~ios_base(local_1f50);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1cf0);
  imrt::Plan::~Plan((Plan *)local_1b78);
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::~vector(&local_1c78);
  imrt::Collimator::~Collimator((Collimator *)local_2198);
  if (local_1c60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1c60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1c48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1c48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1c30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1c30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2288);
  args::FlagBase::~FlagBase((FlagBase *)local_19d0);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2470);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag(&local_2380);
  args::FlagBase::~FlagBase((FlagBase *)&local_1458);
  args::FlagBase::~FlagBase((FlagBase *)&local_1388);
  args::FlagBase::~FlagBase((FlagBase *)&local_1740);
  args::FlagBase::~FlagBase(&local_b48);
  args::FlagBase::~FlagBase(&local_a80);
  args::Group::~Group(&local_14c0);
  args::FlagBase::~FlagBase((FlagBase *)&local_1e28);
  args::FlagBase::~FlagBase(&local_11c0);
  args::FlagBase::~FlagBase(&local_9b8);
  args::FlagBase::~FlagBase(&local_8f0);
  args::FlagBase::~FlagBase(&local_828);
  args::FlagBase::~FlagBase(&local_760);
  args::FlagBase::~FlagBase(&local_698);
  args::FlagBase::~FlagBase(&local_5d0);
  args::Group::~Group(&local_1668);
  args::FlagBase::~FlagBase((FlagBase *)&local_10f8);
  args::FlagBase::~FlagBase((FlagBase *)&local_1028);
  args::FlagBase::~FlagBase((FlagBase *)&local_f58);
  args::FlagBase::~FlagBase((FlagBase *)&local_e88);
  args::FlagBase::~FlagBase((FlagBase *)&local_db8);
  args::Group::~Group(&local_1600);
  args::FlagBase::~FlagBase((FlagBase *)&local_ce8);
  args::FlagBase::~FlagBase((FlagBase *)&local_c18);
  args::FlagBase::~FlagBase((FlagBase *)&local_440);
  args::FlagBase::~FlagBase((FlagBase *)&local_1598);
  args::FlagBase::~FlagBase((FlagBase *)&local_1aa8);
  args::FlagBase::~FlagBase((FlagBase *)&local_370);
  args::FlagBase::~FlagBase((FlagBase *)&local_2a0);
  args::FlagBase::~FlagBase((FlagBase *)&local_1d0);
  args::FlagBase::~FlagBase((FlagBase *)&local_100);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag(&local_12b0);
  args::FlagBase::~FlagBase(&local_508);
  args::ArgumentParser::~ArgumentParser(&local_18d0);
  if (local_1d10[0] != local_1d00) {
    operator_delete(local_1d10[0]);
  }
  if (local_1d30 != local_1d20) {
    operator_delete(local_1d30);
  }
  if (local_1e48 != local_1e38) {
    operator_delete(local_1e48);
  }
  if (local_2498 != local_2488) {
    operator_delete(local_2498);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv){

  int vsize=50;
  int bsize=20;
  int maxiter=5000;
  int maxtime=0;
  int max_apertures=5;
  int open_apertures=-1;
  double alpha=1.0;
  double beta=1.0;
  double maxdelta=5.0;
  double maxratio=3.0;
  bool search_aperture=false;
  bool search_intensity=false;
  string strategy="dao_ls";
  int n=0;

  int initial_intensity=2;
  int max_intensity=28;
  int step_intensity=2;
  bool acceptance=ILS::ACCEPT_NONE;
  int initial_setup;

  // ls params
  double prob_intensity=0.2;
  double temperature, initial_temperature=10;
  double min_temperature=0;
  double alphaT=0.95;
  int perturbation=2;

  string file="data/testinstance_0_70_140_210_280.txt";
  string file2="data/test_instance_coordinates.txt";

  string path=".";

  int seed=time(NULL);

  // Tabu list <<beam,station*>, open> for intensity
  vector<pair<pair<int,Station*>,  bool > > tabu_list_inten;
  // Tabu list <<beam,station*>, <aperture,open>> for aperture
  vector<pair<pair<int,Station*>, pair<int, bool> > > tabu_list_aper;
  int tabusize=10;


	args::ArgumentParser parser("********* IMRT-Solver (Aperture solver) *********", "Example.\n.../AS -s ibo_ls --maxiter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --bsize=5 --vsize=20 --max-apertures=4 --seed=0 --open-apertures=1 --initial-intensity=4 --step-intensity=1 --file-dep=data/Equidistantes/equidist00.txt --file-coord=data/Equidistantes/equidist-coord.txt");
	args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
	//args::ValueFlag<string> _format(parser, "string", "Format: (BR, BRw, 1C)", {'f'});
  args::ValueFlag<string> _strategy(parser, "string", "Strategy  (dao_ls|ibo_ls)", {'s', "strategy"});
	args::ValueFlag<int> _bsize(parser, "int", "Number of considered beamlets for selection ("+to_string(bsize)+")", {"bsize"});
	args::ValueFlag<int> _vsize(parser, "int", "Number of considered worst voxels ("+to_string(vsize)+")", {"vsize"});
 // args::ValueFlag<int> _int0(parser, "int", "Initial intensity for beams  ("+to_string(int0)+")", {"int0"});
  args::ValueFlag<int> _maxdelta(parser, "int", "Max delta  ("+to_string(maxdelta)+")", {"maxdelta"});
  args::ValueFlag<int> _maxratio(parser, "int", "Max ratio  ("+to_string(maxratio)+")", {"maxratio"});
  args::ValueFlag<double> _alpha(parser, "double", "Initial temperature for intensities  ("+to_string(alpha)+")", {"alpha"});
  args::ValueFlag<double> _beta(parser, "double", "Initial temperature for ratio  ("+to_string(beta)+")", {"beta"});
  args::ValueFlag<int> _maxiter(parser, "int", "Number of iterations ("+to_string(maxiter)+")", {"maxiter"});
  args::ValueFlag<int> _maxtime(parser, "int", "Maximum time in seconds ("+to_string(maxtime)+")", {"maxtime"});
  args::ValueFlag<int> _seed(parser, "int", "Seed  ("+to_string(seed)+")", {"seed"});

  args::Group dao_ls (parser, "Direct aperture local search:", args::Group::Validators::DontCare);
  args::ValueFlag<int> _max_apertures(parser, "int", "Initial intensity for the station  ("+to_string(max_apertures)+")", {"max-apertures"});
  args::ValueFlag<int> _open_apertures(parser, "int", "Number of initialized open apertures (-1: all, default:"+to_string(open_apertures)+")", {"open-apertures"});
  args::ValueFlag<int> _initial_intensity(parser, "int", "Initial value aperture intensity  ("+to_string(initial_intensity)+")", {"initial-intensity"});
  args::ValueFlag<int> _max_intensity(parser, "int", "Max value aperture intensity  ("+to_string(max_intensity)+")", {"max-intensity"});
  args::ValueFlag<int> _step_intensity(parser, "int", "Step size for aperture intensity  ("+to_string(step_intensity)+")", {"step-intensity"});

  args::Group setup (parser, "Initial solution setup (these override all provided configurations):", args::Group::Validators::DontCare);
  args::Flag open_max(setup, "open_max", "Open aperture setup with max intensity", {"open-max-setup"});
  args::Flag open_min(setup, "open_min", "Open aperture setup with min intensity", {"open-min-setup"});
  args::Flag closed_min(setup, "closed_min", "Closed aperture setup with min intensity", {"closed-min-setup"});
  args::Flag closed_max(setup, "closed_max", "Closed aperture setup with max intensity", {"closed-max-setup"});
  args::Flag all_rand(setup, "all_rand", "Random aperture setup with random intensity", {"rand-setup"});

  args::Flag ls_aperture(dao_ls, "ls_apertures", "Apply aperture local search", {"ls-aperture"});
  args::Flag ls_intensity(dao_ls, "ls_intensity", "Apply intensity local search", {"ls-intensity"});
  args::ValueFlag<double> _prob_intensity(dao_ls, "double", "Probability to search over intensity  ("+to_string(prob_intensity)+")", {"prob-intensity"});

  args::Group accept (parser, "Acceptance criterion:", args::Group::Validators::AtMostOne);
  args::Flag accept_best(accept, "accept-best", "Accept only improvement", {"accept-best"});
  args::Flag accept_sa(accept, "accept-sa", "Accept as simulated annealing", {"accept-sa"});

  args::ValueFlag<double> _temperature(parser, "double", "Temperature for acceptance criterion  ("+to_string(temperature)+")", {"temperature"});
  args::ValueFlag<double> _alphaT(parser, "double", "Reduction rate of the temperature  ("+to_string(alphaT)+")", {"alphaT"});
  args::ValueFlag<int> _perturbation(parser, "int", "Perturbation size  ("+to_string(perturbation)+")", {"perturbation-size"});
	//args::Flag trace(parser, "trace", "Trace", {"trace"});
  args::ValueFlag<string> _file(parser, "string", "File with the deposition matrix", {"file-dep"});
  args::ValueFlag<string> _file2(parser, "string", "File with the beam coordinates", {"file-coord"});
  args::ValueFlag<int> _n(parser, "int", "Number of instance", {'n'});

  args::ValueFlag<string> _path(parser, "string", "Absolute path of the executable (if it is executed from other directory)", {"path"});

	try
	{
		parser.ParseCLI(argc, argv);

	}
	catch (args::Help&)
	{
		std::cout << parser;
		return 0;
	}
	catch (args::ParseError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}
	catch (args::ValidationError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}

  if(_strategy) strategy=_strategy.Get();
  if(_bsize) bsize=_bsize.Get();
  if(_vsize) vsize=_vsize.Get();
  if(_maxdelta) maxdelta=_maxdelta.Get();
  if(_maxratio) maxratio=_maxratio.Get();
  if(_alpha) alpha=_alpha.Get();
  if(_beta) beta=_beta.Get();
  if(_maxiter) maxiter=_maxiter.Get();
  if(_maxtime) maxtime=_maxtime.Get();
  if(_max_apertures) max_apertures=_max_apertures.Get();
  if(_open_apertures) open_apertures=_open_apertures.Get();
  if(_seed) seed=_seed.Get();
  if(_initial_intensity) initial_intensity=_initial_intensity.Get();
  if(_max_intensity) max_intensity=_max_intensity.Get();
  if(_step_intensity) step_intensity=_step_intensity.Get();
  if(_prob_intensity) prob_intensity=_prob_intensity.Get();
  if(_temperature) temperature=initial_temperature=_temperature.Get();
  if(_alphaT) alphaT=_alphaT.Get();
  if (ls_aperture) search_aperture=true;
  if (ls_intensity) search_intensity=true;
  if(!ls_aperture && !ls_intensity){
    search_aperture=true;
    search_intensity=true;
  }
  if (accept_sa) acceptance=ILS::ACCEPT_SA;
  if (accept_best) acceptance=ILS::ACCEPT_NONE;
  if (_perturbation) perturbation=_perturbation.Get();
  if (_n) n=_n.Get();

  //This should be at the end given that will modify values
  if(open_max) {
    initial_setup=Station::OPEN_MAX_SETUP;
    initial_intensity=max_intensity;
  } else if (open_min) {
    initial_setup=Station::OPEN_MIN_SETUP;
    initial_intensity=0;
  } else if (closed_min) {
    initial_setup=Station::CLOSED_MIN_SETUP;
    initial_intensity=0;
  } else if (closed_max) {
    initial_setup=Station::CLOSED_MAX_SETUP;
    initial_intensity=max_intensity;
  } else if (all_rand) {
    initial_setup=Station::RAND_RAND_SETUP;
 }  else {
    initial_setup=Station::MANUAL_SETUP;
 }
  if (_file) file=_file.Get();
  if (_file2) file2=_file2.Get();
  if (_path) path=_path.Get();

  chdir(path.c_str());

  cout << "##**************************************************************************"<< endl;
  cout << "##**************************************************************************"<< endl;
  if(strategy=="dao_ls")
    cout << "##******** IMRT-Solver (Direct Aperture Optimization Local Search) *********"<< endl;
  else if(strategy=="ibo_ls")
    cout << "##******** IMRT-Solver (Intensity-based Optimization Local Search) *********"<< endl;
  cout << "##**************************************************************************"<< endl;
  cout << "##**************************************************************************"<< endl;

  vector<double> w={1,1,1};
  vector<double> Zmin={0,0,76};
  vector<double> Zmax={65,60,1000};

  Collimator collimator(file2, get_angles(file, 5));
  vector<Volume> volumes= createVolumes (file, collimator);

  Plan P(w, Zmin, Zmax, collimator, volumes, max_apertures, max_intensity, initial_intensity, step_intensity, open_apertures, initial_setup);

  P.writeIntensities("data/Equidistantes/optimalSolutions.txt",n);

  P.printIntensity(0);

  P.printIntensity(1);

  P.printIntensity(2);

  P.printIntensity(3);

  P.printIntensity(4);

  cout << P.eval() << endl;
  P.getEvaluationFunction()->generate_voxel_dose_functions ();
  set<int> l = get_angles(file, 5);

    std::stringstream ss;
    ss << "python plotter/plot.py " << *l.begin()/5 << "_" << strategy << "_" << initial_intensity << "_" << initial_setup << "_" << maxtime << "_" << seed <<".pdf";
    std::string s = ss.str();
    system(s.c_str());


  return 0;

}